

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  uint local_58;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  float fStack_3c;
  bool r;
  ImS32 v32;
  float power_local;
  void *v_max_local;
  void *v_min_local;
  void *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  fStack_3c = power;
  _v32 = v_max;
  v_max_local = v_min;
  v_min_local = v;
  v_local._0_4_ = data_type;
  v_local._4_4_ = id;
  _data_type_local = bb;
  switch(data_type) {
  case 0:
    v32_1 = (ImU32)*v;
    bb_local._7_1_ =
         SliderBehaviorT<int,int,float>
                   (bb,id,4,(int *)&v32_1,(int)*v_min,(int)*v_max,format,power,flags,out_grab_bb);
    if (bb_local._7_1_) {
      *(char *)v_min_local = (char)v32_1;
    }
    break;
  case 1:
    v32_2 = (ImS32)*v;
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_int,int,float>
                   (bb,id,5,(uint *)&v32_2,(uint)*v_min,(uint)*v_max,format,power,flags,out_grab_bb)
    ;
    if (bb_local._7_1_) {
      *(char *)v_min_local = (char)v32_2;
    }
    break;
  case 2:
    v32_3 = (ImU32)*v;
    bb_local._7_1_ =
         SliderBehaviorT<int,int,float>
                   (bb,id,4,(int *)&v32_3,(int)*v_min,(int)*v_max,format,power,flags,out_grab_bb);
    if (bb_local._7_1_) {
      *(short *)v_min_local = (short)v32_3;
    }
    break;
  case 3:
    local_58 = (uint)*v;
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_int,int,float>
                   (bb,id,5,&local_58,(uint)*v_min,(uint)*v_max,format,power,flags,out_grab_bb);
    if (bb_local._7_1_) {
      *(short *)v_min_local = (short)local_58;
    }
    break;
  case 4:
    bVar1 = false;
    if (-0x40000001 < *v_min) {
      bVar1 = *v_max < 0x40000000;
    }
    if (!bVar1) {
      __assert_fail("*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x99c,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<int,int,float>
                   (bb,id,data_type,(int *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 5:
    if (0x7fffffff < *v_min) {
      __assert_fail("*(const ImU32*)v_min <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x99f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_int,int,float>
                   (bb,id,data_type,(uint *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 6:
    bVar1 = false;
    if (-0x4000000000000001 < *v_min) {
      bVar1 = *v_max < 0x4000000000000000;
    }
    if (!bVar1) {
      __assert_fail("*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x9a2,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<long_long,long_long,double>
                   (bb,id,data_type,(longlong *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 7:
    if (0x7fffffffffffffff < *v_min) {
      __assert_fail("*(const ImU64*)v_min <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x9a5,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_long_long,long_long,double>
                   (bb,id,data_type,(unsigned_long_long *)v,*v_min,*v_max,format,power,flags,
                    out_grab_bb);
    break;
  case 8:
    bVar1 = false;
    if (-1.7014117e+38 <= *v_min) {
      bVar1 = *v_max <= 1.7014117e+38;
    }
    if (!bVar1) {
      __assert_fail("*(const float*)v_min >= -3.40282347e+38F/2.0f && *(const float*)v_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x9a8,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<float,float,float>
                   (bb,id,data_type,(float *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 9:
    bVar1 = false;
    if (-8.988465674311579e+307 <= *v_min) {
      bVar1 = *v_max <= 8.988465674311579e+307;
    }
    if (!bVar1) {
      __assert_fail("*(const double*)v_min >= -1.7976931348623157e+308/2.0f && *(const double*)v_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x9ab,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<double,double,double>
                   (bb,id,data_type,(double *)v,*v_min,*v_max,format,power,flags,out_grab_bb);
    break;
  case 10:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x9af,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags, ImRect *)"
                 );
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)v;  bool r = SliderBehaviorT<ImS32, ImS32, float >(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)v_min,  *(const ImS8*)v_max,  format, power, flags, out_grab_bb); if (r) *(ImS8*)v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)v;  bool r = SliderBehaviorT<ImU32, ImS32, float >(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)v_min,  *(const ImU8*)v_max,  format, power, flags, out_grab_bb); if (r) *(ImU8*)v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)v; bool r = SliderBehaviorT<ImS32, ImS32, float >(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)v_min, *(const ImS16*)v_max, format, power, flags, out_grab_bb); if (r) *(ImS16*)v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)v; bool r = SliderBehaviorT<ImU32, ImS32, float >(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)v_min, *(const ImU16*)v_max, format, power, flags, out_grab_bb); if (r) *(ImU16*)v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}